

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O3

void EnumStr(node *p,array *List)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  size_t sVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  long lVar7;
  
  if (p != (node *)0x0) {
    sVar3 = StrTab_Size((strtab *)(*p->VMT + 0x130));
    List->_Begin = (char *)0x0;
    List->_Used = 0;
    ArrayResize(List,sVar3 * 8,0);
    auVar2 = _DAT_00140220;
    if (sVar3 != 0) {
      pcVar1 = List->_Begin;
      lVar4 = sVar3 - 1;
      auVar5._8_4_ = (int)lVar4;
      auVar5._0_8_ = lVar4;
      auVar5._12_4_ = (int)((ulong)lVar4 >> 0x20);
      lVar4 = 0x100;
      auVar5 = auVar5 ^ _DAT_00140220;
      auVar6 = _DAT_00140210;
      do {
        auVar8 = auVar6 ^ auVar2;
        if ((bool)(~(auVar8._4_4_ == auVar5._4_4_ && auVar5._0_4_ < auVar8._0_4_ ||
                    auVar5._4_4_ < auVar8._4_4_) & 1)) {
          *(long *)(pcVar1 + lVar4 * 8 + -0x800) = lVar4;
        }
        if ((auVar8._12_4_ != auVar5._12_4_ || auVar8._8_4_ <= auVar5._8_4_) &&
            auVar8._12_4_ <= auVar5._12_4_) {
          *(long *)(pcVar1 + lVar4 * 8 + -0x7f8) = lVar4 + 1;
        }
        lVar7 = auVar6._8_8_;
        auVar6._0_8_ = auVar6._0_8_ + 2;
        auVar6._8_8_ = lVar7 + 2;
        lVar7 = lVar4 - (sVar3 + 1 & 0xfffffffffffffffe);
        lVar4 = lVar4 + 2;
      } while (lVar7 != 0xfe);
    }
    return;
  }
  __assert_fail("(const void*)(p)!=NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/parser/parser2.c"
                ,0x474,"void EnumStr(node *, array *)");
}

Assistant:

static void EnumStr(node *p,array* List)
{
    dataid Id,*i;
    size_t StrSize = StrTab_Size(&Parser_Context(p)->StrTab);

    ArrayInit(List);
    ArrayResize(List,StrSize*sizeof(dataid),0);
    i = ARRAYBEGIN(*List,dataid);
    for (Id = 0;Id < StrSize;++Id,++i)
        *i = Id+LANG_STRINGS_OFFSET;
}